

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generators.c
# Opt level: O3

void fib_gen(void *null)

{
  Value *pVVar1;
  _Bool _Var2;
  Value *v;
  Value *pVVar3;
  
  gen_yield((Value *)0x0);
  _Var2 = gen_should_finish();
  if (!_Var2) {
    pVVar1 = (Value *)0x1;
    pVVar3 = (Value *)0x0;
    do {
      v = pVVar1;
      gen_yield(v);
      _Var2 = gen_should_finish();
      pVVar1 = (Value *)((long)pVVar3 + (long)v);
      pVVar3 = v;
    } while (!_Var2);
  }
  return;
}

Assistant:

static void
fib_gen(void *null)
{
    (void) null;
    uint64_t f0 = 0;
    uint64_t f1 = 1;
    Value v;
    v.u64 = f0;
    gen_yield(&v);
    while (!gen_should_finish()) {
        v.u64 = f1;
        gen_yield(&v);
        uint64_t tmp = f0;
        f0 = f1;
        f1 += tmp;
    }
}